

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_peer_connection_tests.cpp
# Opt level: O2

void __thiscall LogIPsTestingSetup::LogIPsTestingSetup(LogIPsTestingSetup *this)

{
  long in_FS_OFFSET;
  initializer_list<const_char_*> __l;
  TestOpts in_stack_ffffffffffffffb8;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = "-logips";
  __l._M_len = 1;
  __l._M_array = &local_20;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&stack0xffffffffffffffc0,__l,
             (allocator_type *)&stack0xffffffffffffffbf);
  TestingSetup::TestingSetup(&this->super_TestingSetup,MAIN,in_stack_ffffffffffffffb8);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&stack0xffffffffffffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

LogIPsTestingSetup()
        : TestingSetup{ChainType::MAIN, {.extra_args = {"-logips"}}} {}